

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::Disk::getPrimBounds(Disk *this,size_t param_2,affine3f *xfm)

{
  long in_RSI;
  affine3f *in_RDI;
  vec3f vVar1;
  box3f *bounds;
  affine3f _xfm;
  box3f ob;
  vec3f *this_00;
  affine3f *in_stack_fffffffffffffdc0;
  affine3f *m;
  vec3f *in_stack_fffffffffffffdd8;
  vec3f *this_01;
  box3f *in_stack_fffffffffffffde0;
  box3f *this_02;
  affine3f *in_stack_fffffffffffffe10;
  vec3f local_1e0;
  undefined8 local_1d4;
  float local_1cc;
  undefined8 local_1c8;
  float local_1c0;
  vec3f local_1b4;
  undefined8 local_1a8;
  float local_1a0;
  vec3f local_198;
  box3f local_184;
  undefined8 local_168;
  float local_160;
  vec3f local_154;
  undefined8 local_148;
  float local_140;
  undefined8 local_138;
  float local_130;
  vec3f local_124;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  vec3f local_f4;
  undefined8 local_e8;
  float local_e0;
  vec3f local_d8;
  affine3f local_c4;
  vec3f local_94;
  undefined8 local_88;
  float local_80;
  vec3f local_48;
  vec3f local_3c;
  box3f local_30 [2];
  
  math::vec3f::vec3f(&local_3c,-*(float *)(in_RSI + 0xa0),-*(float *)(in_RSI + 0xa0),0.0);
  math::vec3f::vec3f(&local_48,*(float *)(in_RSI + 0xa0),*(float *)(in_RSI + 0xa0),
                     *(float *)(in_RSI + 0xa4));
  math::box3f::box3f(local_30,&local_3c,&local_48);
  math::operator*(in_stack_fffffffffffffe10,in_RDI);
  math::box3f::empty_box();
  this_00 = &local_94;
  math::vec3f::vec3f(this_00,local_30[0].lower.x,local_30[0].lower.y,local_30[0].lower.z);
  vVar1 = math::xfmPoint(in_stack_fffffffffffffdc0,this_00);
  local_c4.p.x = vVar1.z;
  local_c4.l.vz._4_8_ = vVar1._0_8_;
  local_88 = local_c4.l.vz._4_8_;
  local_80 = local_c4.p.x;
  math::box3f::extend(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  m = &local_c4;
  math::vec3f::vec3f((vec3f *)m,local_30[0].lower.x,local_30[0].lower.y,local_30[0].upper.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_d8.z = vVar1.z;
  local_d8._0_8_ = vVar1._0_8_;
  local_c4.l.vy._0_8_ = local_d8._0_8_;
  local_c4.l.vy.z = local_d8.z;
  math::box3f::extend(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  math::vec3f::vec3f(&local_f4,local_30[0].lower.x,local_30[0].upper.y,local_30[0].lower.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_100 = vVar1.z;
  local_108 = vVar1._0_8_;
  local_e8 = local_108;
  local_e0 = local_100;
  math::box3f::extend(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  math::vec3f::vec3f(&local_124,local_30[0].lower.x,local_30[0].upper.y,local_30[0].upper.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_130 = vVar1.z;
  local_138 = vVar1._0_8_;
  local_118 = local_138;
  local_110 = local_130;
  math::box3f::extend(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  this_01 = &local_154;
  math::vec3f::vec3f(this_01,local_30[0].upper.x,local_30[0].lower.y,local_30[0].lower.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_160 = vVar1.z;
  local_168 = vVar1._0_8_;
  local_148 = local_168;
  local_140 = local_160;
  math::box3f::extend(in_stack_fffffffffffffde0,this_01);
  this_02 = &local_184;
  math::vec3f::vec3f(&this_02->lower,local_30[0].upper.x,local_30[0].lower.y,local_30[0].upper.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_198.z = vVar1.z;
  local_198._0_8_ = vVar1._0_8_;
  local_184.upper._0_8_ = local_198._0_8_;
  local_184.upper.z = local_198.z;
  math::box3f::extend(this_02,this_01);
  math::vec3f::vec3f(&local_1b4,local_30[0].upper.x,local_30[0].upper.y,local_30[0].lower.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_1c0 = vVar1.z;
  local_1c8 = vVar1._0_8_;
  local_1a8 = local_1c8;
  local_1a0 = local_1c0;
  math::box3f::extend(this_02,this_01);
  math::vec3f::vec3f(&local_1e0,local_30[0].upper.x,local_30[0].upper.y,local_30[0].upper.z);
  vVar1 = math::xfmPoint(m,this_00);
  local_1cc = vVar1.z;
  local_1d4 = vVar1._0_8_;
  math::box3f::extend(this_02,this_01);
  return (box3f *)in_RDI;
}

Assistant:

box3f Disk::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f ob(vec3f(-radius,-radius,0),vec3f(+radius,+radius,height));
    affine3f _xfm = xfm * transform;
      
    box3f bounds = box3f::empty_box();
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    return bounds;
  }